

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86compiler.cpp
# Opt level: O0

Error __thiscall
asmjit::X86Compiler::_emit
          (X86Compiler *this,uint32_t instId,Operand_ *o0,Operand_ *o1,Operand_ *o2,Operand_ *o3)

{
  ushort uVar1;
  Error EVar2;
  Error EVar3;
  int iVar4;
  uint *puVar5;
  undefined4 extraout_var;
  undefined8 *puVar6;
  undefined8 *puVar7;
  Zone *pZVar8;
  undefined4 extraout_var_00;
  uint *in_RCX;
  uint *in_RDX;
  uint in_ESI;
  long in_RDI;
  uint *in_R8;
  uint *in_R9;
  Operand *opArray_3;
  CBInst *node_1;
  Error err_1;
  CBLabel *jTarget;
  Operand *opArray_1;
  CBJump *node;
  StringBuilderTmp<256UL> sb;
  Error err;
  Operand opArray [4];
  uint32_t kErrorsAndSpecialCases;
  uint32_t opCount;
  char *inlineComment;
  uint32_t options;
  uint32_t i_1;
  uint32_t opCount_2;
  Operand *opArray_4;
  uint32_t i;
  uint32_t opCount_1;
  Operand *opArray_2;
  size_t allocatedSize_1;
  size_t allocatedSize;
  undefined8 in_stack_fffffffffffff6d0;
  undefined4 in_stack_fffffffffffff6d8;
  uint uVar9;
  undefined4 in_stack_fffffffffffff6dc;
  undefined4 in_stack_fffffffffffff6e0;
  Error in_stack_fffffffffffff6e4;
  CodeEmitter *in_stack_fffffffffffff6e8;
  CodeEmitter *in_stack_fffffffffffff6f0;
  char *pcVar10;
  StringBuilder *in_stack_fffffffffffff6f8;
  StringBuilder *in_stack_fffffffffffff700;
  Operand_ *in_stack_fffffffffffff710;
  Operand_ *in_stack_fffffffffffff718;
  uint32_t uVar11;
  CodeBuilder *in_stack_fffffffffffff720;
  undefined2 in_stack_fffffffffffff758;
  undefined1 in_stack_fffffffffffff75a;
  bool bVar12;
  undefined4 in_stack_fffffffffffff75c;
  size_t in_stack_fffffffffffff760;
  undefined1 **ppuVar13;
  undefined4 in_stack_fffffffffffff768;
  undefined4 in_stack_fffffffffffff76c;
  undefined1 *local_848;
  undefined8 local_840;
  undefined8 local_838;
  undefined8 local_830;
  undefined1 local_828 [100];
  uint32_t in_stack_fffffffffffff83c;
  Operand_ *in_stack_fffffffffffff840;
  Operand_ *in_stack_fffffffffffff848;
  uint32_t in_stack_fffffffffffff854;
  uint32_t in_stack_fffffffffffff858;
  uint32_t in_stack_fffffffffffff85c;
  undefined8 local_718;
  undefined8 local_710;
  undefined8 local_708;
  undefined8 local_700;
  undefined8 local_6f8;
  undefined8 local_6f0;
  undefined8 local_6e8;
  undefined8 local_6e0;
  undefined4 local_6d0;
  uint local_6cc;
  char *local_6c8;
  uint local_6bc;
  uint *local_6b8;
  uint *local_6b0;
  uint *local_6a8;
  uint *local_6a0;
  uint local_694;
  Error local_684;
  undefined4 local_680;
  undefined4 local_67c;
  undefined8 *local_638;
  undefined8 *local_628;
  undefined8 *local_618;
  undefined8 *local_608;
  undefined1 **local_5f0;
  undefined8 local_5e8;
  char *local_5e0;
  undefined1 **local_5d8;
  undefined8 local_5d0;
  char *local_5c8;
  undefined1 **local_5c0;
  undefined1 **local_5b8;
  uint local_59c;
  long local_598;
  long *local_590;
  uint *local_588;
  undefined8 *local_580;
  uint *local_578;
  undefined8 *local_570;
  uint *local_568;
  undefined8 *local_560;
  uint *local_558;
  undefined8 *local_550;
  uint *local_548;
  char *in_stack_fffffffffffffac0;
  undefined8 in_stack_fffffffffffffac8;
  char *in_stack_fffffffffffffad0;
  uint local_248;
  uint local_230;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffac8 >> 0x20);
  EVar3 = (Error)((ulong)in_stack_fffffffffffff6d0 >> 0x20);
  local_6bc = *(uint *)(in_RDI + 0x3c) | *(uint *)(in_RDI + 0x38);
  local_6c8 = *(char **)(in_RDI + 0x40);
  local_6cc = (uint)(((*in_RDX & 7) == 0 ^ 0xffU) & 1) + (uint)(((*in_RCX & 7) == 0 ^ 0xffU) & 1) +
              (uint)(((*in_R8 & 7) == 0 ^ 0xffU) & 1) + (uint)(((*in_R9 & 7) == 0 ^ 0xffU) & 1);
  local_6d0 = 3;
  local_6b8 = in_R9;
  local_6b0 = in_R8;
  local_6a8 = in_RCX;
  local_6a0 = in_RDX;
  local_694 = in_ESI;
  if ((local_6bc & 3) != 0) {
    if (*(int *)(in_RDI + 0x2c) != 0) {
      return *(Error *)(in_RDI + 0x2c);
    }
    if ((local_6bc & 2) != 0) {
      local_638 = &local_718;
      local_718 = *(undefined8 *)in_RDX;
      local_710 = *(undefined8 *)(in_RDX + 2);
      local_628 = &local_708;
      local_708 = *(undefined8 *)in_RCX;
      local_700 = *(undefined8 *)(in_RCX + 2);
      local_618 = &local_6f8;
      local_6f8 = *(undefined8 *)in_R8;
      local_6f0 = *(undefined8 *)(in_R8 + 2);
      local_608 = &local_6e8;
      local_6e8 = *(undefined8 *)in_R9;
      local_6e0 = *(undefined8 *)(in_R9 + 2);
      EVar2 = X86Inst::validate(in_stack_fffffffffffff85c,in_stack_fffffffffffff858,
                                in_stack_fffffffffffff854,in_stack_fffffffffffff848,
                                in_stack_fffffffffffff840,in_stack_fffffffffffff83c);
      if (EVar2 != 0) {
        ppuVar13 = &local_848;
        local_848 = local_828;
        uVar11 = (uint32_t)in_stack_fffffffffffff720;
        local_828[0] = 0;
        local_840 = 0;
        local_838 = 0x100;
        local_830 = 0;
        local_5f0 = ppuVar13;
        local_5c8 = DebugUtils::errorAsString(EVar3);
        local_5d0 = 0xffffffffffffffff;
        local_5c0 = ppuVar13;
        StringBuilder::_opString
                  (in_stack_fffffffffffff6f8,(uint32_t)((ulong)in_stack_fffffffffffff6f0 >> 0x20),
                   (char *)in_stack_fffffffffffff6e8,
                   CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
        local_5e0 = ": ";
        local_5e8 = 0xffffffffffffffff;
        local_5d8 = ppuVar13;
        StringBuilder::_opString
                  (in_stack_fffffffffffff6f8,(uint32_t)((ulong)in_stack_fffffffffffff6f0 >> 0x20),
                   (char *)in_stack_fffffffffffff6e8,
                   CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
        uVar9 = local_6cc;
        Logging::formatInstruction
                  (in_stack_fffffffffffff700,(uint32_t)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
                   in_stack_fffffffffffff6f0,(uint32_t)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                   (uint32_t)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e4,
                   in_stack_fffffffffffff710,in_stack_fffffffffffff718,uVar11);
        local_5b8 = ppuVar13;
        local_684 = CodeEmitter::setLastError
                              (in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e4,
                               (char *)CONCAT44(in_stack_fffffffffffff6dc,uVar9));
        StringBuilderTmp<256UL>::~StringBuilderTmp((StringBuilderTmp<256UL> *)0x14a058);
        return local_684;
      }
      local_6bc = local_6bc & 0xfffffffd;
    }
  }
  uVar11 = (uint32_t)((ulong)in_stack_fffffffffffff710 >> 0x20);
  *(undefined4 *)(in_RDI + 0x3c) = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  local_59c = local_694;
  if ((local_694 < 0x113) || (bVar12 = true, 0x132 < local_694)) {
    in_stack_fffffffffffff75a = 0x175 < local_694 && local_694 < 0x179;
    bVar12 = (bool)in_stack_fffffffffffff75a;
  }
  if (bVar12 == false) {
    if (*(long *)(in_RDI + 0xe0) == 0) {
      DebugUtils::assertionFailed(in_stack_fffffffffffffad0,iVar4,in_stack_fffffffffffffac0);
    }
    puVar6 = (undefined8 *)
             ZoneHeap::_alloc((ZoneHeap *)
                              CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                              in_stack_fffffffffffff760,
                              (size_t *)
                              CONCAT44(in_stack_fffffffffffff75c,
                                       (uint)CONCAT12(in_stack_fffffffffffff75a,
                                                      in_stack_fffffffffffff758)));
    puVar7 = puVar6 + 9;
    if (puVar6 == (undefined8 *)0x0) {
      local_680 = 1;
      local_684 = CodeEmitter::setLastError
                            (in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e4,
                             (char *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    }
    else {
      if (local_6cc != 0) {
        local_558 = local_6a0;
        *puVar7 = *(undefined8 *)local_6a0;
        puVar6[10] = *(undefined8 *)(local_6a0 + 2);
        local_550 = puVar7;
      }
      if (1 < local_6cc) {
        local_560 = puVar6 + 0xb;
        local_568 = local_6a8;
        *local_560 = *(undefined8 *)local_6a8;
        puVar6[0xc] = *(undefined8 *)(local_6a8 + 2);
      }
      if (2 < local_6cc) {
        local_570 = puVar6 + 0xd;
        local_578 = local_6b0;
        *local_570 = *(undefined8 *)local_6b0;
        puVar6[0xe] = *(undefined8 *)(local_6b0 + 2);
      }
      if (3 < local_6cc) {
        local_580 = puVar6 + 0xf;
        local_588 = local_6b8;
        *local_580 = *(undefined8 *)local_6b8;
        puVar6[0x10] = *(undefined8 *)(local_6b8 + 2);
      }
      *puVar6 = 0;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 1;
      *(undefined1 *)((long)puVar6 + 0x11) = 0;
      *(short *)((long)puVar6 + 0x12) = (short)*(undefined4 *)(in_RDI + 0x18c);
      *(undefined4 *)((long)puVar6 + 0x14) = *(undefined4 *)(in_RDI + 0x188);
      puVar6[3] = 0;
      puVar6[4] = 0;
      puVar6[6] = 0;
      puVar6[7] = 0;
      *(ushort *)((long)puVar6 + 0x12) = *(ushort *)((long)puVar6 + 0x12) | 4;
      *(short *)(puVar6 + 5) = (short)local_694;
      *(undefined1 *)((long)puVar6 + 0x2b) = 0;
      *(uint *)((long)puVar6 + 0x2c) = local_6bc;
      *(char *)((long)puVar6 + 0x11) = (char)local_6cc;
      puVar6[8] = puVar7;
      for (local_248 = 0; local_248 < *(byte *)((long)puVar6 + 0x11); local_248 = local_248 + 1) {
        if ((*(uint *)(puVar6[8] + (ulong)local_248 * 0x10) & 7) == 2) goto LAB_0014b26d;
      }
      local_248 = 0xff;
LAB_0014b26d:
      *(char *)((long)puVar6 + 0x2a) = (char)local_248;
      puVar6[6] = *(undefined8 *)(in_RDI + 0x48);
      puVar6[7] = *(undefined8 *)(in_RDI + 0x50);
      *(undefined8 *)(in_RDI + 0x48) = 0;
      *(undefined8 *)(in_RDI + 0x50) = 0;
      if (local_6c8 != (char *)0x0) {
        pZVar8 = (Zone *)(in_RDI + 0xa0);
        pcVar10 = local_6c8;
        strlen(local_6c8);
        iVar4 = Zone::dup(pZVar8,(int)pcVar10);
        local_6c8 = (char *)CONCAT44(extraout_var_00,iVar4);
        puVar6[3] = local_6c8;
      }
      CodeBuilder::addNode
                ((CodeBuilder *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                 (CBNode *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
      local_684 = 0;
    }
  }
  else {
    local_590 = (long *)(in_RDI + 0xe0);
    local_598 = (ulong)local_6cc * 0x10 + 0x58;
    if (*local_590 == 0) {
      DebugUtils::assertionFailed(in_stack_fffffffffffffad0,iVar4,in_stack_fffffffffffffac0);
    }
    puVar6 = (undefined8 *)
             ZoneHeap::_alloc((ZoneHeap *)
                              CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                              in_stack_fffffffffffff760,
                              (size_t *)
                              CONCAT44(in_stack_fffffffffffff75c,
                                       CONCAT13(bVar12,CONCAT12(in_stack_fffffffffffff75a,
                                                                in_stack_fffffffffffff758))));
    puVar5 = (uint *)(puVar6 + 0xb);
    if (puVar6 == (undefined8 *)0x0) {
      local_67c = 1;
      local_684 = CodeEmitter::setLastError
                            (in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e4,
                             (char *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    }
    else {
      if (local_6cc != 0) {
        *(undefined8 *)puVar5 = *(undefined8 *)local_6a0;
        puVar6[0xc] = *(undefined8 *)(local_6a0 + 2);
      }
      if (1 < local_6cc) {
        puVar6[0xd] = *(undefined8 *)local_6a8;
        puVar6[0xe] = *(undefined8 *)(local_6a8 + 2);
      }
      if (2 < local_6cc) {
        puVar6[0xf] = *(undefined8 *)local_6b0;
        puVar6[0x10] = *(undefined8 *)(local_6b0 + 2);
      }
      if (3 < local_6cc) {
        local_548 = local_6b8;
        puVar6[0x11] = *(undefined8 *)local_6b8;
        puVar6[0x12] = *(undefined8 *)(local_6b8 + 2);
      }
      *puVar6 = 0;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 1;
      *(undefined1 *)((long)puVar6 + 0x11) = 0;
      *(short *)((long)puVar6 + 0x12) = (short)*(undefined4 *)(in_RDI + 0x18c);
      *(undefined4 *)((long)puVar6 + 0x14) = *(undefined4 *)(in_RDI + 0x188);
      puVar6[3] = 0;
      puVar6[4] = 0;
      puVar6[6] = 0;
      puVar6[7] = 0;
      *(ushort *)((long)puVar6 + 0x12) = *(ushort *)((long)puVar6 + 0x12) | 4;
      *(short *)(puVar6 + 5) = (short)local_694;
      *(undefined1 *)((long)puVar6 + 0x2b) = 0;
      *(uint *)((long)puVar6 + 0x2c) = local_6bc;
      *(char *)((long)puVar6 + 0x11) = (char)local_6cc;
      puVar6[8] = puVar5;
      for (local_230 = 0; local_230 < *(byte *)((long)puVar6 + 0x11); local_230 = local_230 + 1) {
        if ((*(uint *)(puVar6[8] + (ulong)local_230 * 0x10) & 7) == 2) goto LAB_0014a763;
      }
      local_230 = 0xff;
LAB_0014a763:
      *(char *)((long)puVar6 + 0x2a) = (char)local_230;
      puVar6[9] = 0;
      puVar6[10] = 0;
      puVar6[6] = *(undefined8 *)(in_RDI + 0x48);
      puVar6[7] = *(undefined8 *)(in_RDI + 0x50);
      *(undefined8 *)(in_RDI + 0x48) = 0;
      *(undefined8 *)(in_RDI + 0x50) = 0;
      if ((local_6bc & 0x10) == 0) {
        if ((*puVar5 & 7) == 4) {
          EVar3 = CodeBuilder::getCBLabel
                            (in_stack_fffffffffffff720,(CBLabel **)in_stack_fffffffffffff718,uVar11)
          ;
          if (EVar3 != 0) {
            EVar3 = CodeEmitter::setLastError
                              (in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e4,
                               (char *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8)
                              );
            return EVar3;
          }
        }
        else {
          local_6bc = local_6bc | 0x10;
        }
      }
      pcVar10 = local_6c8;
      *(uint *)((long)puVar6 + 0x2c) = local_6bc;
      uVar1 = 0x20;
      if (local_694 == 0x11e) {
        uVar1 = 0x50;
      }
      *(ushort *)((long)puVar6 + 0x12) = *(ushort *)((long)puVar6 + 0x12) | uVar1;
      puVar6[9] = 0;
      puVar6[10] = 0;
      if (local_694 == 0x11e) {
        *(ushort *)((long)puVar6 + 0x12) = *(ushort *)((long)puVar6 + 0x12) | 0x40;
      }
      else if ((local_6bc & 0x100) != 0) {
        *(ushort *)((long)puVar6 + 0x12) = *(ushort *)((long)puVar6 + 0x12) | 0x40;
      }
      if (local_6c8 != (char *)0x0) {
        pZVar8 = (Zone *)(in_RDI + 0xa0);
        strlen(local_6c8);
        iVar4 = Zone::dup(pZVar8,(int)pcVar10);
        local_6c8 = (char *)CONCAT44(extraout_var,iVar4);
        puVar6[3] = local_6c8;
      }
      CodeBuilder::addNode
                ((CodeBuilder *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                 (CBNode *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
      local_684 = 0;
    }
  }
  return local_684;
}

Assistant:

Error X86Compiler::_emit(uint32_t instId, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_& o3) {
  uint32_t options = getOptions() | getGlobalOptions();
  const char* inlineComment = getInlineComment();

  uint32_t opCount = static_cast<uint32_t>(!o0.isNone()) +
                     static_cast<uint32_t>(!o1.isNone()) +
                     static_cast<uint32_t>(!o2.isNone()) +
                     static_cast<uint32_t>(!o3.isNone()) ;

  // Handle failure and rare cases first.
  const uint32_t kErrorsAndSpecialCases = kOptionMaybeFailureCase | // CodeEmitter is in error state.
                                          kOptionStrictValidation ; // Strict validation.

  if (ASMJIT_UNLIKELY(options & kErrorsAndSpecialCases)) {
    // Don't do anything if we are in error state.
    if (_lastError) return _lastError;

#if !defined(ASMJIT_DISABLE_VALIDATION)
    // Strict validation.
    if (options & kOptionStrictValidation) {
      Operand opArray[] = {
        Operand(o0),
        Operand(o1),
        Operand(o2),
        Operand(o3)
      };

      Error err = X86Inst::validate(getArchType(), instId, options, _extraOp, opArray, opCount);
      if (err) {
#if !defined(ASMJIT_DISABLE_LOGGING)
        StringBuilderTmp<256> sb;
        sb.appendString(DebugUtils::errorAsString(err));
        sb.appendString(": ");
        Logging::formatInstruction(sb, 0, this, getArchType(), instId, options, _extraOp, opArray, opCount);
        return setLastError(err, sb.getData());
#else
        return setLastError(err);
#endif
      }

      // Clear it as it must be enabled explicitly on assembler side.
      options &= ~kOptionStrictValidation;
    }
#endif // ASMJIT_DISABLE_VALIDATION
  }

  resetOptions();
  resetInlineComment();

  // decide between `CBInst` and `CBJump`.
  if (isJumpInst(instId)) {
    CBJump* node = _cbHeap.allocT<CBJump>(sizeof(CBJump) + opCount * sizeof(Operand));
    Operand* opArray = reinterpret_cast<Operand*>(reinterpret_cast<uint8_t*>(node) + sizeof(CBJump));

    if (ASMJIT_UNLIKELY(!node))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

    if (opCount > 0) opArray[0].copyFrom(o0);
    if (opCount > 1) opArray[1].copyFrom(o1);
    if (opCount > 2) opArray[2].copyFrom(o2);
    if (opCount > 3) opArray[3].copyFrom(o3);

    new(node) CBJump(this, instId, options, opArray, opCount);
    node->_extraOp = _extraOp;
    _extraOp.reset();

    CBLabel* jTarget = nullptr;
    if (!(options & kOptionUnfollow)) {
      if (opArray[0].isLabel()) {
        Error err = getCBLabel(&jTarget, static_cast<Label&>(opArray[0]));
        if (err) return setLastError(err);
      }
      else {
        options |= kOptionUnfollow;
      }
    }
    node->setOptions(options);

    node->orFlags(instId == X86Inst::kIdJmp ? CBNode::kFlagIsJmp | CBNode::kFlagIsTaken : CBNode::kFlagIsJcc);
    node->_target = jTarget;
    node->_jumpNext = nullptr;

    if (jTarget) {
      node->_jumpNext = static_cast<CBJump*>(jTarget->_from);
      jTarget->_from = node;
      jTarget->addNumRefs();
    }

    // The 'jmp' is always taken, conditional jump can contain hint, we detect it.
    if (instId == X86Inst::kIdJmp)
      node->orFlags(CBNode::kFlagIsTaken);
    else if (options & X86Inst::kOptionTaken)
      node->orFlags(CBNode::kFlagIsTaken);

    if (inlineComment) {
      inlineComment = static_cast<char*>(_cbDataZone.dup(inlineComment, ::strlen(inlineComment), true));
      node->setInlineComment(inlineComment);
    }

    addNode(node);
    return kErrorOk;
  }
  else {
    CBInst* node = _cbHeap.allocT<CBInst>(sizeof(CBInst) + opCount * sizeof(Operand));
    Operand* opArray = reinterpret_cast<Operand*>(reinterpret_cast<uint8_t*>(node) + sizeof(CBInst));

    if (ASMJIT_UNLIKELY(!node))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

    if (opCount > 0) opArray[0].copyFrom(o0);
    if (opCount > 1) opArray[1].copyFrom(o1);
    if (opCount > 2) opArray[2].copyFrom(o2);
    if (opCount > 3) opArray[3].copyFrom(o3);

    node = new(node) CBInst(this, instId, options, opArray, opCount);
    node->_extraOp = _extraOp;
    _extraOp.reset();

    if (inlineComment) {
      inlineComment = static_cast<char*>(_cbDataZone.dup(inlineComment, ::strlen(inlineComment), true));
      node->setInlineComment(inlineComment);
    }

    addNode(node);
    return kErrorOk;
  }
}